

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitBrOn
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,BrOn *curr)

{
  BasicHeapType BVar1;
  HeapType heapType;
  HeapType local_30;
  Type local_28;
  
  if (curr->op - BrOnCast < 2) {
    local_30 = wasm::Type::getHeapType(&curr->castType);
    BVar1 = HeapType::getTop(&local_30);
    heapType.id._4_4_ = 0;
    heapType.id._0_4_ = BVar1;
    wasm::Type::Type(&local_28,heapType,Nullable,Inexact);
    IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
              ((ConstraintCollector *)this,&curr->ref,local_28);
    return;
  }
  if (curr->op < BrOnCast) {
    IRBuilder::ChildPopper::ConstraintCollector::noteAnyReferenceType
              ((ConstraintCollector *)this,&curr->ref);
    return;
  }
  handle_unreachable("unexpected op",
                     "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/child-typer.h"
                     ,0x369);
}

Assistant:

void visitBrOn(BrOn* curr) {
    switch (curr->op) {
      case BrOnNull:
      case BrOnNonNull:
        noteAnyReference(&curr->ref);
        return;
      case BrOnCast:
      case BrOnCastFail: {
        auto top = curr->castType.getHeapType().getTop();
        note(&curr->ref, Type(top, Nullable));
        return;
      }
    }
    WASM_UNREACHABLE("unexpected op");
  }